

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O2

uint64_t helper_punpcklhw_mips(uint64_t fs,uint64_t ft)

{
  return fs & 0xffff | (ulong)((uint)fs & 0xffff0000) << 0x10 |
         (ulong)((uint)ft & 0xffff0000) << 0x20 | (ulong)((uint)ft << 0x10);
}

Assistant:

uint64_t helper_punpcklhw(uint64_t fs, uint64_t ft)
{
    unsigned host = BYTE_ORDER_XOR(3);
    LMIValue vd, vs, vt;

    vs.d = fs;
    vt.d = ft;
    vd.uh[0 ^ host] = vs.uh[0 ^ host];
    vd.uh[1 ^ host] = vt.uh[0 ^ host];
    vd.uh[2 ^ host] = vs.uh[1 ^ host];
    vd.uh[3 ^ host] = vt.uh[1 ^ host];

    return vd.d;
}